

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O1

void __thiscall
TasGrid::GridFourier::updateGrid
          (GridFourier *this,int depth,TypeDepth type,
          vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  int cnum_outputs;
  undefined4 in_register_00000034;
  GridFourier *this_00;
  MultiIndexSet new_tensors;
  MultiIndexSet local_50;
  
  this_00 = (GridFourier *)CONCAT44(in_register_00000034,depth);
  cnum_outputs = (this->super_BaseCanonicalGrid).num_outputs;
  if ((cnum_outputs == 0) ||
     ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    makeGrid(this,(this->super_BaseCanonicalGrid).num_dimensions,cnum_outputs,depth,type,
             anisotropic_weights,level_limits);
  }
  else {
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])(this);
    selectTensors(&local_50,this_00,(long)(this->super_BaseCanonicalGrid).num_dimensions,depth,type,
                  anisotropic_weights,level_limits);
    (this->updated_tensors).cache_num_indexes = local_50.cache_num_indexes;
    (this->updated_tensors).num_dimensions = local_50.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(this->updated_tensors).indexes,&local_50.indexes);
    if (local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    MultiIndexSet::operator-(&local_50,&this->updated_tensors,&this->tensors);
    if (local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (this->updated_tensors).num_dimensions = (this->tensors).num_dimensions;
      MultiIndexSet::addSortedIndexes(&this->updated_tensors,&(this->tensors).indexes);
      proposeUpdatedTensors(this);
    }
    if (local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void GridFourier::updateGrid(int depth, TypeDepth type, const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    if ((num_outputs == 0) || points.empty()){
        makeGrid(num_dimensions, num_outputs, depth, type, anisotropic_weights, level_limits);
    }else{
        clearRefinement();

        updated_tensors = selectTensors((size_t) num_dimensions, depth, type, anisotropic_weights, level_limits);

        MultiIndexSet new_tensors = updated_tensors - tensors;

        if (!new_tensors.empty()){
            updated_tensors += tensors;
            proposeUpdatedTensors();
        }
    }
}